

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O3

void __thiscall
r_exec::_GMonitor::store_simulated_outcome
          (_GMonitor *this,Goal *affected_goal,Sim *sim,bool success)

{
  atomic_int_fast64_t *paVar1;
  SimMode SVar2;
  undefined3 in_register_00000009;
  SolutionList *pSVar3;
  pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_> local_18;
  
  SVar2 = sim->mode;
  local_18.first.object = (_Object *)affected_goal;
  local_18.second.object = &sim->super__Object;
  if (CONCAT31(in_register_00000009,success) == 0) {
    if (SVar2 == SIM_OPTIONAL) {
      pSVar3 = &(this->sim_failures).optional_solutions;
      if (affected_goal != (Goal *)0x0) {
        LOCK();
        paVar1 = &(affected_goal->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
      LOCK();
      paVar1 = &(sim->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      std::__cxx11::
      list<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>,std::allocator<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>>
      ::_M_insert<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>
                ((list<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>,std::allocator<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>>
                  *)pSVar3,(iterator)pSVar3,&local_18);
    }
    else {
      if (SVar2 != SIM_MANDATORY) {
        return;
      }
      pSVar3 = &(this->sim_failures).optional_solutions;
      if (affected_goal != (Goal *)0x0) {
        LOCK();
        paVar1 = &(affected_goal->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
      LOCK();
      paVar1 = &(sim->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      std::__cxx11::
      list<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>,std::allocator<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>>
      ::_M_insert<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>
                ((list<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>,std::allocator<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>>
                  *)pSVar3,(iterator)pSVar3,&local_18);
    }
  }
  else if (SVar2 == SIM_OPTIONAL) {
    if (affected_goal != (Goal *)0x0) {
      LOCK();
      paVar1 = &(affected_goal->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                super_LObject.super_Code.super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    LOCK();
    paVar1 = &(sim->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    std::__cxx11::
    list<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>,std::allocator<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>>
    ::_M_insert<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>
              ((list<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>,std::allocator<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>>
                *)&this->sim_successes,(iterator)&this->sim_successes,&local_18);
  }
  else {
    if (SVar2 != SIM_MANDATORY) {
      return;
    }
    if (affected_goal != (Goal *)0x0) {
      LOCK();
      paVar1 = &(affected_goal->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                super_LObject.super_Code.super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    LOCK();
    paVar1 = &(sim->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    std::__cxx11::
    list<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>,std::allocator<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>>
    ::_M_insert<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>
              ((list<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>,std::allocator<std::pair<core::P<r_exec::Goal>,core::P<r_exec::Sim>>>>
                *)&this->sim_successes,(iterator)&this->sim_successes,&local_18);
  }
  if ((Sim *)local_18.second.object != (Sim *)0x0) {
    LOCK();
    ((local_18.second.object)->refCount).super___atomic_base<long>._M_i =
         ((local_18.second.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_18.second.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*((_Object *)&(local_18.second.object)->_vptr__Object)->_vptr__Object[1])();
    }
  }
  if ((Goal *)local_18.first.object != (Goal *)0x0) {
    LOCK();
    ((local_18.first.object)->refCount).super___atomic_base<long>._M_i =
         ((local_18.first.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_18.first.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(((LObject *)&(local_18.first.object)->_vptr__Object)->
        super_Object<r_code::LObject,_r_exec::LObject>).super_LObject.super_Code.super__Object.
        _vptr__Object[1])();
    }
  }
  return;
}

Assistant:

void _GMonitor::store_simulated_outcome(Goal *affected_goal, Sim *sim, bool success)   // outcome is f0 as in f0->pred->f1->success.
{
    if (success) {
        switch (sim->mode) {
        case SIM_MANDATORY:
            sim_successes.mandatory_solutions.push_back(std::pair<P<Goal>, P<Sim> >(affected_goal, sim));
            break;

        case SIM_OPTIONAL:
            sim_successes.mandatory_solutions.push_back(std::pair<P<Goal>, P<Sim> >(affected_goal, sim));
            break;

        default:
            break;
        }
    } else {
        switch (sim->mode) {
        case SIM_MANDATORY:
            sim_failures.optional_solutions.push_back(std::pair<P<Goal>, P<Sim> >(affected_goal, sim));
            break;

        case SIM_OPTIONAL:
            sim_failures.optional_solutions.push_back(std::pair<P<Goal>, P<Sim> >(affected_goal, sim));
            break;

        default:
            break;
        }
    }
}